

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3StrAccumEnlarge(StrAccum *p,i64 N)

{
  sqlite3 *psVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (p->accError != '\0') {
    return 0;
  }
  uVar5 = (ulong)p->mxAlloc;
  if (uVar5 == 0) {
    sqlite3StrAccumSetError(p,'\x12');
    return ~p->nChar + p->nAlloc;
  }
  if ((p->printfFlags & 4) == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = p->zText;
  }
  uVar8 = N + (ulong)p->nChar * 2 + 1;
  uVar7 = N + (ulong)p->nChar + 1;
  if ((long)uVar8 <= (long)uVar5) {
    uVar7 = uVar8;
  }
  if ((long)uVar5 < (long)uVar7) {
    sqlite3_str_reset(p);
    sqlite3StrAccumSetError(p,'\x12');
  }
  else {
    p->nAlloc = (u32)uVar7;
    if (p->db == (sqlite3 *)0x0) {
      pcVar6 = (char *)sqlite3Realloc(pcVar6,uVar7 & 0xffffffff);
    }
    else {
      pcVar6 = (char *)sqlite3DbRealloc(p->db,pcVar6,uVar7 & 0xffffffff);
    }
    if (pcVar6 != (char *)0x0) {
      if (((p->printfFlags & 4) == 0) && ((ulong)p->nChar != 0)) {
        memcpy(pcVar6,p->zText,(ulong)p->nChar);
      }
      p->zText = pcVar6;
      psVar1 = p->db;
      if ((psVar1 == (sqlite3 *)0x0) || ((psVar1->lookaside).pTrueEnd <= pcVar6)) {
LAB_001180f7:
        uVar3 = (*sqlite3Config.m.xSize)(pcVar6);
      }
      else {
        uVar3 = 0x80;
        if (pcVar6 < (psVar1->lookaside).pMiddle) {
          if (pcVar6 < (psVar1->lookaside).pStart) goto LAB_001180f7;
          uVar3 = (uint)(psVar1->lookaside).szTrue;
        }
      }
      p->nAlloc = uVar3;
      p->printfFlags = p->printfFlags | 4;
      bVar2 = true;
      goto LAB_0011810b;
    }
    sqlite3_str_reset(p);
    p->accError = '\a';
    if (p->mxAlloc != 0) {
      sqlite3_str_reset(p);
    }
  }
  bVar2 = false;
LAB_0011810b:
  iVar4 = 0;
  if (bVar2) {
    iVar4 = (int)N;
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3StrAccumEnlarge(StrAccum *p, i64 N){
  char *zNew;
  assert( p->nChar+N >= p->nAlloc ); /* Only called if really needed */
  if( p->accError ){
    testcase(p->accError==SQLITE_TOOBIG);
    testcase(p->accError==SQLITE_NOMEM);
    return 0;
  }
  if( p->mxAlloc==0 ){
    sqlite3StrAccumSetError(p, SQLITE_TOOBIG);
    return p->nAlloc - p->nChar - 1;
  }else{
    char *zOld = isMalloced(p) ? p->zText : 0;
    i64 szNew = p->nChar + N + 1;
    if( szNew+p->nChar<=p->mxAlloc ){
      /* Force exponential buffer size growth as long as it does not overflow,
      ** to avoid having to call this routine too often */
      szNew += p->nChar;
    }
    if( szNew > p->mxAlloc ){
      sqlite3_str_reset(p);
      sqlite3StrAccumSetError(p, SQLITE_TOOBIG);
      return 0;
    }else{
      p->nAlloc = (int)szNew;
    }
    if( p->db ){
      zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
    }else{
      zNew = sqlite3Realloc(zOld, p->nAlloc);
    }
    if( zNew ){
      assert( p->zText!=0 || p->nChar==0 );
      if( !isMalloced(p) && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
      p->zText = zNew;
      p->nAlloc = sqlite3DbMallocSize(p->db, zNew);
      p->printfFlags |= SQLITE_PRINTF_MALLOCED;
    }else{
      sqlite3_str_reset(p);
      sqlite3StrAccumSetError(p, SQLITE_NOMEM);
      return 0;
    }
  }
  assert( N>=0 && N<=0x7fffffff );
  return (int)N;
}